

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaParserCtxtPtr xmlSchemaNewParserCtxtUseDict(char *URL,xmlDictPtr dict)

{
  xmlChar *pxVar1;
  xmlSchemaParserCtxtPtr ret;
  xmlDictPtr dict_local;
  char *URL_local;
  
  URL_local = (char *)xmlSchemaParserCtxtCreate();
  if ((xmlSchemaParserCtxtPtr)URL_local == (xmlSchemaParserCtxtPtr)0x0) {
    URL_local = (char *)0x0;
  }
  else {
    ((xmlSchemaParserCtxtPtr)URL_local)->dict = dict;
    xmlDictReference(dict);
    if (URL != (char *)0x0) {
      pxVar1 = xmlDictLookup(dict,(xmlChar *)URL,-1);
      ((xmlSchemaParserCtxtPtr)URL_local)->URL = pxVar1;
    }
  }
  return (xmlSchemaParserCtxtPtr)URL_local;
}

Assistant:

static xmlSchemaParserCtxtPtr
xmlSchemaNewParserCtxtUseDict(const char *URL, xmlDictPtr dict)
{
    xmlSchemaParserCtxtPtr ret;

    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
        return (NULL);
    ret->dict = dict;
    xmlDictReference(dict);
    if (URL != NULL)
	ret->URL = xmlDictLookup(dict, (const xmlChar *) URL, -1);
    return (ret);
}